

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qringbuffer.cpp
# Opt level: O2

void __thiscall QRingBuffer::chop(QRingBuffer *this,qint64 bytes)

{
  QRingChunk *pQVar1;
  Data *pDVar2;
  long lVar3;
  iterator iVar4;
  
  while( true ) {
    if (bytes < 1) {
      return;
    }
    lVar3 = (this->buffers).d.size;
    if (lVar3 == 1) break;
    pQVar1 = (this->buffers).d.ptr;
    lVar3 = pQVar1[lVar3 + -1].tailOffset - pQVar1[lVar3 + -1].headOffset;
    if (bytes < lVar3) break;
    this->bufferSize = this->bufferSize - lVar3;
    QList<QRingChunk>::removeLast(&this->buffers);
    bytes = bytes - lVar3;
  }
  iVar4 = QList<QRingChunk>::end(&this->buffers);
  lVar3 = this->bufferSize - bytes;
  if (lVar3 != 0) {
    iVar4.i[-1].tailOffset = iVar4.i[-1].tailOffset - bytes;
    this->bufferSize = lVar3;
    return;
  }
  if (((iVar4.i[-1].chunk.d.size <= (long)this->basicBlockSize) &&
      (pDVar2 = iVar4.i[-1].chunk.d.d, pDVar2 != (Data *)0x0)) &&
     ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> == 1)) {
    iVar4.i[-1].headOffset = 0;
    iVar4.i[-1].tailOffset = 0;
    this->bufferSize = 0;
    return;
  }
  clear(this);
  return;
}

Assistant:

void QRingBuffer::chop(qint64 bytes)
{
    Q_ASSERT(bytes <= bufferSize);

    while (bytes > 0) {
        const qsizetype chunkSize = buffers.constLast().size();

        if (buffers.size() == 1 || chunkSize > bytes) {
            QRingChunk &chunk = buffers.last();
            // keep a single block around if it does not exceed
            // the basic block size, to avoid repeated allocations
            // between uses of the buffer
            if (bufferSize == bytes) {
                if (chunk.capacity() <= basicBlockSize && !chunk.isShared()) {
                    chunk.reset();
                    bufferSize = 0;
                } else {
                    clear(); // try to minify/squeeze us
                }
            } else {
                Q_ASSERT(bytes < QByteArray::maxSize());
                chunk.grow(-bytes);
                bufferSize -= bytes;
            }
            return;
        }

        bufferSize -= chunkSize;
        bytes -= chunkSize;
        buffers.removeLast();
    }
}